

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_e24fa::DiskInterfaceTestStatExistingDir::Run
          (DiskInterfaceTestStatExistingDir *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  TimeStamp TVar6;
  TimeStamp TVar7;
  RealDiskInterface *this_00;
  string err;
  string local_90;
  string local_70;
  string local_50;
  
  pTVar3 = g_current_test;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"subdir","");
  this_00 = &(this->super_DiskInterfaceTest).disk_;
  bVar4 = RealDiskInterface::MakeDir(this_00,&local_90);
  bVar4 = testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                     ,0x5a,"disk_.MakeDir(\"subdir\")");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = g_current_test;
  if (bVar4) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"subdir/subsubdir","");
    bVar4 = RealDiskInterface::MakeDir(this_00,&local_90);
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                       ,0x5b,"disk_.MakeDir(\"subdir/subsubdir\")");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pTVar3 = g_current_test;
    if (bVar4) {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"..","");
      TVar6 = RealDiskInterface::Stat(this_00,&local_90,&local_70);
      testing::Test::Check
                (pTVar3,1 < TVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x5c,"disk_.Stat(\"..\", &err) > 1");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x5d,"\"\" == err");
      pTVar3 = g_current_test;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".","");
      TVar6 = RealDiskInterface::Stat(this_00,&local_90,&local_70);
      testing::Test::Check
                (pTVar3,1 < TVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x5e,"disk_.Stat(\".\", &err) > 1");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x5f,"\"\" == err");
      pTVar3 = g_current_test;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"subdir","");
      TVar6 = RealDiskInterface::Stat(this_00,&local_90,&local_70);
      testing::Test::Check
                (pTVar3,1 < TVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x60,"disk_.Stat(\"subdir\", &err) > 1");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x61,"\"\" == err");
      pTVar3 = g_current_test;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"subdir/subsubdir","");
      TVar6 = RealDiskInterface::Stat(this_00,&local_90,&local_70);
      testing::Test::Check
                (pTVar3,1 < TVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x62,"disk_.Stat(\"subdir/subsubdir\", &err) > 1");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,99,"\"\" == err");
      pTVar3 = g_current_test;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"subdir","");
      TVar6 = RealDiskInterface::Stat(this_00,&local_90,&local_70);
      paVar2 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"subdir/.","");
      TVar7 = RealDiskInterface::Stat(this_00,&local_50,&local_70);
      testing::Test::Check
                (pTVar3,TVar6 == TVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x66,"disk_.Stat(\"subdir\", &err) == disk_.Stat(\"subdir/.\", &err)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"subdir","");
      TVar6 = RealDiskInterface::Stat(this_00,&local_90,&local_70);
      local_50._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"subdir/subsubdir/..","");
      TVar7 = RealDiskInterface::Stat(this_00,&local_50,&local_70);
      testing::Test::Check
                (pTVar3,TVar6 == TVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x68,"disk_.Stat(\"subdir\", &err) == disk_.Stat(\"subdir/subsubdir/..\", &err)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"subdir/subsubdir","");
      TVar6 = RealDiskInterface::Stat(this_00,&local_90,&local_70);
      local_50._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"subdir/subsubdir/.","");
      TVar7 = RealDiskInterface::Stat(this_00,&local_50,&local_70);
      testing::Test::Check
                (pTVar3,TVar6 == TVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                 ,0x6a,
                 "disk_.Stat(\"subdir/subsubdir\", &err) == disk_.Stat(\"subdir/subsubdir/.\", &err)"
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00155db7;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00155db7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatExistingDir) {
  string err;
  ASSERT_TRUE(disk_.MakeDir("subdir"));
  ASSERT_TRUE(disk_.MakeDir("subdir/subsubdir"));
  EXPECT_GT(disk_.Stat("..", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat(".", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat("subdir", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat("subdir/subsubdir", &err), 1);
  EXPECT_EQ("", err);

  EXPECT_EQ(disk_.Stat("subdir", &err),
            disk_.Stat("subdir/.", &err));
  EXPECT_EQ(disk_.Stat("subdir", &err),
            disk_.Stat("subdir/subsubdir/..", &err));
  EXPECT_EQ(disk_.Stat("subdir/subsubdir", &err),
            disk_.Stat("subdir/subsubdir/.", &err));
}